

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O2

bool __thiscall crnlib::find_files::find(find_files *this,char *pSpec,uint flags)

{
  bool bVar1;
  char *pFilespec;
  char *pBasepath;
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_name;
  dynamic_string local_48;
  dynamic_string local_38;
  dynamic_string local_28;
  
  dynamic_string::dynamic_string(&local_28,pSpec);
  bVar1 = file_utils::full_path(&local_28);
  if (bVar1) {
    local_38.m_buf_size = 0;
    local_38.m_len = 0;
    local_38.m_pStr = (char *)0x0;
    local_48.m_buf_size = 0;
    local_48.m_len = 0;
    local_48.m_pStr = (char *)0x0;
    if (local_28.m_pStr == (char *)0x0) {
      local_28.m_pStr = "";
    }
    bVar1 = file_utils::split_path(local_28.m_pStr,&local_38,&local_48);
    if (bVar1) {
      pBasepath = local_38.m_pStr;
      if (local_38.m_pStr == (char *)0x0) {
        pBasepath = "";
      }
      pFilespec = local_48.m_pStr;
      if (local_48.m_pStr == (char *)0x0) {
        pFilespec = "";
      }
      bVar1 = find(this,pBasepath,pFilespec,flags);
    }
    else {
      bVar1 = false;
    }
    dynamic_string::~dynamic_string(&local_48);
    dynamic_string::~dynamic_string(&local_38);
  }
  else {
    bVar1 = false;
  }
  dynamic_string::~dynamic_string(&local_28);
  return bVar1;
}

Assistant:

bool find_files::find(const char* pSpec, uint flags)
    {
        dynamic_string find_name(pSpec);

        if (!file_utils::full_path(find_name))
        {
            return false;
        }

        dynamic_string find_pathname, find_filename;
        if (!file_utils::split_path(find_name.get_ptr(), find_pathname, find_filename))
        {
            return false;
        }

        return find(find_pathname.get_ptr(), find_filename.get_ptr(), flags);
    }